

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::TriangleInterpolationTest::iterate
          (TriangleInterpolationTest *this)

{
  pointer pSVar1;
  pointer pVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestLog *log;
  undefined1 auVar4 [16];
  TriangleInterpolationTest *pTVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  pointer pVVar10;
  ulong *puVar11;
  size_type *psVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  char *description;
  IterateResult IVar17;
  undefined8 uVar18;
  pointer pSVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  string iterationDescription;
  ScopedLogSection section;
  Vec4 colors [3];
  RasterizationArguments args;
  undefined1 local_288 [24];
  long lStack_270;
  TriangleInterpolationTest *local_260;
  undefined1 local_258 [32];
  string local_238;
  undefined1 local_218 [40];
  string local_1f0;
  ScopedLogSection local_1d0;
  undefined1 local_1c8 [8];
  pointer apSStack_1c0 [2];
  float afStack_1b0 [4];
  undefined1 *puStack_1a0;
  float local_198 [2];
  float afStack_190 [2];
  float local_188 [2];
  float afStack_180 [2];
  float local_178 [2];
  float afStack_170 [2];
  bool local_168 [16];
  ios_base local_158 [8];
  ios_base local_150 [268];
  RasterizationArguments local_44;
  
  iVar7 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<((ostringstream *)local_1c8,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x1c06ce9);
  pVVar2 = (pointer)(local_288 + 0x10);
  pVVar10 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pVVar10) {
    local_288._16_8_ = *(undefined8 *)pVVar10->m_data;
    lStack_270 = plVar8[3];
    local_288._0_8_ = pVVar2;
  }
  else {
    local_288._16_8_ = *(undefined8 *)pVVar10->m_data;
    local_288._0_8_ = (pointer)*plVar8;
  }
  local_288._8_8_ = plVar8[1];
  *plVar8 = (long)pVVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_288);
  paVar3 = &local_238.field_2;
  puVar11 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_238.field_2._M_allocated_capacity = *puVar11;
    local_238.field_2._8_8_ = plVar8[3];
    local_238._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_238.field_2._M_allocated_capacity = *puVar11;
    local_238._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_238._M_string_length = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pSVar1 = (pointer)((long)((Vec4 *)local_258._8_8_)->m_data + local_238._M_string_length);
  uVar18 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    uVar18 = local_238.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < pSVar1) {
    pSVar19 = (pointer)0xf;
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      pSVar19 = (pointer)local_258._16_8_;
    }
    if (pSVar1 <= pSVar19) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_258,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      goto LAB_01082398;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,local_258._0_8_);
LAB_01082398:
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar12;
    local_1f0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1f0._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)((long)((Vec4 *)local_258._16_8_)->m_data + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_288._0_8_ != pVVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(float *)local_288._16_8_ + 1));
  }
  if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,(ulong)((long)(float *)local_218._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar7 = this->m_iteration;
  local_260 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1c07054);
  pTVar5 = local_260;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_238.field_2._M_allocated_capacity = *psVar12;
    local_238.field_2._8_8_ = plVar8[3];
    local_238._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar12;
    local_238._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_238._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,log,&local_238,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar3) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_288._0_8_ != pVVar2) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(float *)local_288._16_8_ + 1));
  }
  iVar7 = (pTVar5->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_238,iVar7,iVar7);
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (pointer)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_1c8 = (undefined1  [8])0x3f800000;
  apSStack_1c0[0] = (pointer)0x3f80000000000000;
  apSStack_1c0[1] = (pointer)0x3f80000000000000;
  afStack_1b0[0] = 0.0;
  afStack_1b0[1] = 1.0;
  afStack_1b0[2] = 0.0;
  afStack_1b0[3] = 0.0;
  puStack_1a0 = &DAT_3f8000003f800000;
  deRandom_init((deRandom *)&local_44,
                pTVar5->m_iteration * 1000 + *(int *)&(pTVar5->super_BaseRenderingCase).field_0xc4 +
                0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_288,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,6);
  if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4)) {
    lVar20 = 0;
    uVar22 = 0;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar22;
      fVar23 = deRandom_getFloat((deRandom *)&local_44);
      *(float *)((long)(float *)local_288._0_8_ + lVar20) = fVar23 * 1.8 + -0.9;
      fVar23 = deRandom_getFloat((deRandom *)&local_44);
      *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) = fVar23 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_288._0_8_ + lVar20 + 8) = 0;
      fVar23 = 1.0;
      if (pTVar5->m_projective == true) {
        fVar23 = deRandom_getFloat((deRandom *)&local_44);
        fVar23 = fVar23 * 3.8 + 0.2;
        *(float *)((long)(float *)local_288._0_8_ + lVar20) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20) * fVar23;
        *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20 + 4) * fVar23;
        *(float *)((long)(float *)local_288._0_8_ + lVar20 + 8) =
             *(float *)((long)(float *)local_288._0_8_ + lVar20 + 8) * fVar23;
      }
      *(float *)((long)(float *)local_288._0_8_ + lVar20 + 0xc) = fVar23;
      uVar18 = *(undefined8 *)
                ((long)(local_1c8 +
                       lVar20 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe
                                ) * -0x18) + 8);
      puVar9 = (undefined8 *)((long)(float *)local_218._0_8_ + lVar20);
      *puVar9 = *(undefined8 *)
                 (local_1c8 +
                 lVar20 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                          -0x18);
      puVar9[1] = uVar18;
      uVar22 = uVar22 + 1;
      lVar20 = lVar20 + 0x10;
    } while ((long)uVar22 < (long)(int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4));
  }
  iVar7 = *(int *)&(pTVar5->super_BaseRenderingCase).field_0xc4;
  if (iVar7 == 4) {
    if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2) {
      iVar7 = 0;
      do {
        local_1c8 = *(undefined1 (*) [8])((pointer)(local_288._0_8_ + (long)iVar7 * 0x10))->m_data;
        apSStack_1c0[0] =
             *(pointer *)(((pointer)(local_288._0_8_ + (long)iVar7 * 0x10))->m_data + 2);
        apSStack_1c0[1] =
             *(pointer *)((pointer)(local_288._0_8_ + (long)(iVar7 + 1) * 0x10))->m_data;
        afStack_1b0._0_8_ =
             *(undefined8 *)(((pointer)(local_288._0_8_ + (long)(iVar7 + 1) * 0x10))->m_data + 2);
        iVar16 = iVar7 + 2;
        afStack_1b0._8_8_ =
             *(undefined8 *)((pointer)(local_288._0_8_ + (long)iVar16 * 0x10))->m_data;
        puStack_1a0 = *(undefined1 **)
                       (((pointer)(local_288._0_8_ + (long)iVar16 * 0x10))->m_data + 2);
        local_168[0] = false;
        local_168[1] = false;
        local_168[2] = false;
        if ((local_260->super_BaseRenderingCase).m_flatshade == true) {
          local_198 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data;
          afStack_190 = *(float (*) [2])
                         (((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data + 2);
          local_188 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data;
          afStack_180 = *(float (*) [2])
                         (((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data + 2);
        }
        else {
          local_198 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)iVar7 * 0x10))->m_data;
          afStack_190 = *(float (*) [2])
                         (((pointer)(local_218._0_8_ + (long)iVar7 * 0x10))->m_data + 2);
          local_188 = *(float (*) [2])
                       ((pointer)(local_218._0_8_ + (long)(iVar7 + 1) * 0x10))->m_data;
          afStack_180 = *(float (*) [2])
                         (((pointer)(local_218._0_8_ + (long)(iVar7 + 1) * 0x10))->m_data + 2);
        }
        local_178 = *(float (*) [2])((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data;
        afStack_170 = *(float (*) [2])
                       (((pointer)(local_218._0_8_ + (long)iVar16 * 0x10))->m_data + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_258,(value_type *)local_1c8);
        iVar7 = iVar7 + 3;
      } while (iVar7 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2);
    }
  }
  else if (iVar7 == 5) {
    if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -2) {
      lVar21 = 0x200000000;
      lVar14 = 0x10;
      lVar20 = 0;
      do {
        pfVar13 = (float *)((long)((pointer)(local_288._0_8_ + -0x10))->m_data + lVar14);
        local_1c8 = *(undefined1 (*) [8])pfVar13;
        apSStack_1c0[0] = *(pointer *)(pfVar13 + 2);
        pfVar13 = (float *)((long)(float *)local_288._0_8_ + lVar14);
        apSStack_1c0[1] = *(pointer *)pfVar13;
        afStack_1b0._0_8_ = *(undefined8 *)(pfVar13 + 2);
        lVar15 = lVar21 >> 0x20;
        pfVar13 = (float *)((long)(float *)local_288._0_8_ + (lVar21 >> 0x1c));
        afStack_1b0._8_8_ = *(undefined8 *)pfVar13;
        puStack_1a0 = *(undefined1 **)(pfVar13 + 2);
        local_168[0] = false;
        local_168[1] = false;
        local_168[2] = false;
        if ((local_260->super_BaseRenderingCase).m_flatshade == true) {
          local_198 = *(float (*) [2])((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data;
          afStack_190 = *(float (*) [2])(((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data + 2);
          local_188 = *(float (*) [2])((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data;
          afStack_180 = *(float (*) [2])(((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data + 2);
        }
        else {
          pfVar13 = (float *)((long)((pointer)(local_218._0_8_ + -0x10))->m_data + lVar14);
          local_198 = *(float (*) [2])pfVar13;
          afStack_190 = *(float (*) [2])(pfVar13 + 2);
          pfVar13 = (float *)((long)(float *)local_218._0_8_ + lVar14);
          local_188 = *(float (*) [2])pfVar13;
          afStack_180 = *(float (*) [2])(pfVar13 + 2);
        }
        local_178 = *(float (*) [2])((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data;
        afStack_170 = *(float (*) [2])(((pointer)(local_218._0_8_ + lVar15 * 0x10))->m_data + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_258,(value_type *)local_1c8);
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + 0x100000000;
        lVar14 = lVar14 + 0x10;
      } while (lVar20 < (local_288._8_8_ - local_288._0_8_) * 0x10000000 + -0x200000000 >> 0x20);
    }
  }
  else if ((iVar7 == 6) && (1 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4) + -1)) {
    lVar20 = 1;
    lVar21 = 0x20;
    do {
      local_1c8 = *(undefined1 (*) [8])(float *)local_288._0_8_;
      apSStack_1c0[0] = *(pointer *)((float *)local_288._0_8_ + 2);
      pfVar13 = (float *)((long)((pointer)(local_288._0_8_ + -0x10))->m_data + lVar21);
      apSStack_1c0[1] = *(pointer *)pfVar13;
      afStack_1b0._0_8_ = *(undefined8 *)(pfVar13 + 2);
      lVar20 = lVar20 + 1;
      pfVar13 = (float *)((long)(float *)local_288._0_8_ + lVar21);
      afStack_1b0._8_8_ = *(undefined8 *)pfVar13;
      puStack_1a0 = *(undefined1 **)(pfVar13 + 2);
      local_168[0] = false;
      local_168[1] = false;
      local_168[2] = false;
      if ((local_260->super_BaseRenderingCase).m_flatshade == true) {
        pfVar13 = (float *)((long)(float *)local_218._0_8_ + lVar21);
        local_198 = *(float (*) [2])pfVar13;
        afStack_190 = *(float (*) [2])(pfVar13 + 2);
        pfVar13 = (float *)((long)(float *)local_218._0_8_ + lVar21);
        local_188 = *(float (*) [2])pfVar13;
        afStack_180 = *(float (*) [2])(pfVar13 + 2);
        lVar14 = lVar21;
      }
      else {
        local_198 = *(float (*) [2])(float *)local_218._0_8_;
        afStack_190 = *(float (*) [2])((float *)local_218._0_8_ + 2);
        pfVar13 = (float *)((long)((pointer)(local_218._0_8_ + -0x10))->m_data + lVar21);
        local_188 = *(float (*) [2])pfVar13;
        afStack_180 = *(float (*) [2])(pfVar13 + 2);
        lVar14 = lVar20 * 0x10;
      }
      pfVar13 = (float *)((long)(float *)local_218._0_8_ + lVar14);
      local_178 = *(float (*) [2])pfVar13;
      afStack_170 = *(float (*) [2])(pfVar13 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)local_258,(value_type *)local_1c8);
      lVar21 = lVar21 + 0x10;
    } while (lVar20 < (local_288._8_8_ - local_288._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
  }
  local_1c8 = (undefined1  [8])
              ((local_260->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)apSStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)apSStack_1c0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)apSStack_1c0);
  std::ios_base::~ios_base(local_150);
  if (0 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4)) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      local_1c8 = (undefined1  [8])
                  ((local_260->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)apSStack_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)apSStack_1c0,"\t",1);
      tcu::operator<<((ostream *)apSStack_1c0,
                      (Vector<float,_4> *)((long)(float *)local_288._0_8_ + lVar20));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)apSStack_1c0,",\tcolor= ",9);
      tcu::operator<<((ostream *)apSStack_1c0,
                      (Vector<float,_4> *)((long)(float *)local_218._0_8_ + lVar20));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)apSStack_1c0);
      std::ios_base::~ios_base(local_150);
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar21 < (int)((ulong)(local_288._8_8_ - local_288._0_8_) >> 4));
  }
  pTVar5 = local_260;
  BaseRenderingCase::drawPrimitives
            (&local_260->super_BaseRenderingCase,(Surface *)&local_238,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_288,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,
             *(GLenum *)&(local_260->super_BaseRenderingCase).field_0xc4);
  local_44.numSamples = (pTVar5->super_BaseRenderingCase).m_numSamples;
  local_44.subpixelBits = (pTVar5->super_BaseRenderingCase).m_subpixelBits;
  local_44.redBits = (pTVar5->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_44.greenBits = (pTVar5->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_44.blueBits = (pTVar5->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1c8 = (undefined1  [8])local_258._0_8_;
  apSStack_1c0[0] = (pointer)local_258._8_8_;
  apSStack_1c0[1] = (pointer)local_258._16_8_;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  bVar6 = tcu::verifyTriangleGroupInterpolation
                    ((Surface *)&local_238,(TriangleSceneSpec *)local_1c8,&local_44,
                     ((pTVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx)->m_log);
  if (!bVar6) {
    pTVar5->m_allIterationsPassed = false;
  }
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,(long)apSStack_1c0[1] - (long)local_1c8);
  }
  iVar7 = pTVar5->m_iteration + 1;
  pTVar5->m_iteration = iVar7;
  IVar17 = CONTINUE;
  if (iVar7 == pTVar5->m_iterationCount) {
    description = "Found invalid pixel values";
    if (pTVar5->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar17 = STOP;
    tcu::TestContext::setTestResult
              ((pTVar5->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,pTVar5->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if ((pointer)local_258._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ - local_258._0_8_);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  if ((pointer)local_288._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
  }
  tcu::Surface::~Surface((Surface *)&local_238);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return IVar17;
}

Assistant:

TriangleInterpolationTest::IterateResult TriangleInterpolationTest::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_testCtx.getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");

		return STOP;
	}
	else
		return CONTINUE;
}